

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_4::PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *this,
          size_t *newMemUsed)

{
  PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *in_RDI;
  Entry *entries;
  size_t *in_stack_00000060;
  Entry *in_stack_00000068;
  PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *in_stack_00000070;
  Entry *local_18;
  
  local_18 = lockEntries(in_RDI);
  if (in_RDI->_numEntries <= in_RDI->_size << 1) {
    local_18 = grow(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  return local_18;
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }